

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_tables.c
# Opt level: O0

size_t mm_table_load(mm_context_t *context,uint8_t table_id,uint64_t version_timestamp,
                    uint8_t *buffer,size_t buflen)

{
  int iVar1;
  size_t blob_len;
  char sql [512];
  size_t buflen_local;
  uint8_t *buffer_local;
  uint64_t version_timestamp_local;
  uint8_t table_id_local;
  mm_context_t *context_local;
  
  memset(&blob_len,0,0x200);
  snprintf((char *)&blob_len,0x200,
           "SELECT TABLE_DATA from TERMDAT where (TABLE_ID = %d and VERSION_TIMESTAMP = %lu);",
           (ulong)table_id,version_timestamp);
  iVar1 = mm_sql_read_blob(context->database,(char *)&blob_len,buffer,buflen);
  return (long)iVar1;
}

Assistant:

size_t mm_table_load(mm_context_t *context, uint8_t table_id, uint64_t version_timestamp, uint8_t *buffer, size_t buflen) {
    char sql[512] = { 0 };
    size_t blob_len;

    snprintf(sql, sizeof(sql), "SELECT TABLE_DATA from TERMDAT where (TABLE_ID = %d and VERSION_TIMESTAMP = %" PRIu64 ");",
        table_id, version_timestamp);

    blob_len = mm_sql_read_blob(context->database, sql, buffer, buflen);

    return blob_len;
}